

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSat.c
# Opt level: O1

void Cec2_ManSimClassRefineOne(Gia_Man_t *p,int iRepr)

{
  word *pwVar1;
  word *pwVar2;
  Gia_Rpr_t *pGVar3;
  word *pwVar4;
  int *piVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  
  if (((~(uint)p->pReprs[iRepr] & 0xfffffff) != 0) || (p->pNexts[iRepr] < 1)) {
    __assert_fail("Gia_ObjIsHead(p, iRepr)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                  ,0x251,"void Cec2_ManSimClassRefineOne(Gia_Man_t *, int)");
  }
  uVar9 = p->pNexts[iRepr];
  if (0 < (int)uVar9) {
    uVar10 = p->nSimWords;
    uVar6 = uVar10 * iRepr;
    if (-1 < (int)uVar6) {
      iVar7 = p->vSims->nSize;
      if ((int)uVar6 < iVar7) {
        pwVar4 = p->vSims->pArray;
        pwVar1 = pwVar4 + uVar6;
        uVar14 = (ulong)(uint)iRepr;
        uVar6 = uVar9;
        do {
          uVar8 = uVar14;
          uVar9 = uVar10 * uVar6;
          if (((int)uVar9 < 0) || (iVar7 <= (int)uVar9)) goto LAB_00646ba4;
          pwVar2 = pwVar4 + uVar9;
          uVar9 = uVar6;
          if ((((uint)*pwVar2 ^ (uint)*pwVar1) & 1) == 0) {
            if (0 < (int)uVar10) {
              uVar14 = 0;
              do {
                if (pwVar1[uVar14] != pwVar2[uVar14]) goto LAB_00646a60;
                uVar14 = uVar14 + 1;
              } while (uVar10 != uVar14);
            }
          }
          else if (0 < (int)uVar10) {
            uVar14 = 0;
            do {
              if ((pwVar2[uVar14] ^ pwVar1[uVar14]) != 0xffffffffffffffff) goto LAB_00646a60;
              uVar14 = uVar14 + 1;
            } while (uVar10 != uVar14);
          }
          uVar9 = p->pNexts[uVar6];
          uVar8 = (ulong)uVar6;
          uVar14 = (ulong)uVar6;
          uVar6 = uVar9;
        } while (0 < (int)uVar9);
        goto LAB_00646a60;
      }
    }
LAB_00646ba4:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                  ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
  }
  uVar8 = (ulong)(uint)iRepr;
LAB_00646a60:
  iVar7 = (int)uVar8;
  if (0 < (int)uVar9) {
    pGVar3 = p->pReprs + uVar9;
    *pGVar3 = (Gia_Rpr_t)((uint)*pGVar3 | 0xfffffff);
    uVar10 = p->pNexts[uVar9];
    uVar6 = uVar9;
    if (0 < (int)uVar10) {
LAB_00646a99:
      uVar11 = p->nSimWords;
      uVar13 = uVar11 * iRepr;
      if (-1 < (int)uVar13) {
        iVar7 = p->vSims->nSize;
        if ((((int)uVar13 < iVar7) && (uVar12 = uVar11 * uVar10, -1 < (int)uVar12)) &&
           ((int)uVar12 < iVar7)) {
          pwVar4 = p->vSims->pArray;
          pwVar1 = pwVar4 + uVar13;
          pwVar4 = pwVar4 + uVar12;
          if ((((uint)*pwVar4 ^ (uint)*pwVar1) & 1) == 0) {
            if (0 < (int)uVar11) {
              uVar14 = 0;
              do {
                if (pwVar1[uVar14] != pwVar4[uVar14]) goto LAB_00646b38;
                uVar14 = uVar14 + 1;
              } while (uVar11 != uVar14);
            }
          }
          else if (0 < (int)uVar11) {
            uVar14 = 0;
            do {
              if ((pwVar4[uVar14] ^ pwVar1[uVar14]) != 0xffffffffffffffff) goto LAB_00646b38;
              uVar14 = uVar14 + 1;
            } while (uVar11 != uVar14);
          }
          uVar11 = (uint)uVar8;
          uVar8 = (ulong)uVar10;
          goto LAB_00646b5f;
        }
      }
      goto LAB_00646ba4;
    }
LAB_00646b7e:
    piVar5 = p->pNexts;
    piVar5[iVar7] = -1;
    piVar5[(int)uVar6] = -1;
  }
  return;
LAB_00646b38:
  if ((uVar9 != 0xfffffff) && ((int)uVar10 <= (int)uVar9)) {
    __assert_fail("Num == GIA_VOID || Num < Id",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x400,"void Gia_ObjSetRepr(Gia_Man_t *, int, int)");
  }
  p->pReprs[uVar10] = (Gia_Rpr_t)((uint)p->pReprs[uVar10] & 0xf0000000 | uVar9 & 0xfffffff);
  uVar11 = uVar6;
  uVar6 = uVar10;
LAB_00646b5f:
  iVar7 = (int)uVar8;
  piVar5 = p->pNexts;
  piVar5[(int)uVar11] = uVar10;
  uVar10 = piVar5[uVar10];
  if ((int)uVar10 < 1) goto LAB_00646b7e;
  goto LAB_00646a99;
}

Assistant:

void Cec2_ManSimClassRefineOne( Gia_Man_t * p, int iRepr )
{
    int iObj, iPrev = iRepr, iPrev2, iRepr2;
    Gia_ClassForEachObj1( p, iRepr, iRepr2 )
        if ( Cec2_ObjSimEqual(p, iRepr, iRepr2) )
            iPrev = iRepr2;
        else
            break;
    if ( iRepr2 <= 0 ) // no refinement
        return;
    // relink remaining nodes of the class
    // nodes that are equal to iRepr, remain in the class of iRepr
    // nodes that are not equal to iRepr, move to the class of iRepr2
    Gia_ObjSetRepr( p, iRepr2, GIA_VOID );
    iPrev2 = iRepr2;
    for ( iObj = Gia_ObjNext(p, iRepr2); iObj > 0; iObj = Gia_ObjNext(p, iObj) )
    {
        if ( Cec2_ObjSimEqual(p, iRepr, iObj) ) // remains with iRepr
        {
            Gia_ObjSetNext( p, iPrev, iObj );
            iPrev = iObj;
        }
        else // moves to iRepr2
        {
            Gia_ObjSetRepr( p, iObj, iRepr2 );
            Gia_ObjSetNext( p, iPrev2, iObj );
            iPrev2 = iObj;
        }
    }
    Gia_ObjSetNext( p, iPrev, -1 );
    Gia_ObjSetNext( p, iPrev2, -1 );
}